

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseLookupString(xmlParserCtxtPtr ctxt,size_t startDelta,char *str,size_t strLen)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  long lVar5;
  xmlChar *__haystack;
  xmlChar *pxVar6;
  
  pxVar1 = ctxt->input;
  pxVar2 = pxVar1->cur;
  if (ctxt->checkIndex != 0) {
    startDelta = ctxt->checkIndex;
  }
  __haystack = pxVar2 + startDelta;
  pxVar4 = (xmlChar *)strstr((char *)__haystack,str);
  if (pxVar4 == (xmlChar *)0x0) {
    pxVar3 = pxVar1->end;
    pxVar4 = pxVar3 + -strLen;
    pxVar6 = pxVar4 + 1;
    if ((ulong)((long)pxVar3 - (long)__haystack) < strLen) {
      pxVar6 = __haystack;
    }
    lVar5 = (long)pxVar6 - (long)pxVar2;
    if (-1 < lVar5) {
      ctxt->checkIndex = lVar5;
      return (xmlChar *)0x0;
    }
  }
  ctxt->checkIndex = 0;
  return pxVar4;
}

Assistant:

static const xmlChar *
xmlParseLookupString(xmlParserCtxtPtr ctxt, size_t startDelta,
                     const char *str, size_t strLen) {
    const xmlChar *cur, *term;

    if (ctxt->checkIndex == 0) {
        cur = ctxt->input->cur + startDelta;
    } else {
        cur = ctxt->input->cur + ctxt->checkIndex;
    }

    term = BAD_CAST strstr((const char *) cur, str);
    if (term == NULL) {
        const xmlChar *end = ctxt->input->end;
        size_t index;

        /* Rescan (strLen - 1) characters. */
        if ((size_t) (end - cur) < strLen)
            end = cur;
        else
            end -= strLen - 1;
        index = end - ctxt->input->cur;
        if (index > LONG_MAX) {
            ctxt->checkIndex = 0;
            return(ctxt->input->end - strLen);
        }
        ctxt->checkIndex = index;
    } else {
        ctxt->checkIndex = 0;
    }

    return(term);
}